

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnDecimal::Append(ColumnDecimal *this,Int128 *value)

{
  Code CVar1;
  Column local_48;
  
  std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> *)&local_48,
             &(((this->data_).super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>);
  CVar1 = Type::GetCode((Type *)local_48._vptr_Column);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.super_enable_shared_from_this<clickhouse::Column>);
  if (CVar1 == Int32) {
    Column::As<clickhouse::ColumnVector<int>>(&local_48);
    local_48.super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
    super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         (int)value->v_;
    ColumnVector<int>::Append
              ((ColumnVector<int> *)local_48._vptr_Column,
               (int *)&local_48.super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
                       super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  else {
    std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> *)&local_48,
               &(((this->data_).super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->type_).super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>);
    CVar1 = Type::GetCode((Type *)local_48._vptr_Column);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_48.super_enable_shared_from_this<clickhouse::Column>);
    if (CVar1 == Int64) {
      Column::As<clickhouse::ColumnVector<long>>(&local_48);
      local_48.super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
      super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&value->v_;
      ColumnVector<long>::Append
                ((ColumnVector<long> *)local_48._vptr_Column,
                 (long *)&local_48.super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
                          super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
    }
    else {
      Column::As<clickhouse::ColumnVector<absl::int128>>(&local_48);
      local_48.super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
      super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&value->v_;
      local_48.type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)((long)&value->v_ + 8);
      ColumnVector<absl::int128>::Append
                ((ColumnVector<absl::int128> *)local_48._vptr_Column,
                 (int128 *)
                 &local_48.super_enable_shared_from_this<clickhouse::Column>._M_weak_this.
                  super___weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.super_enable_shared_from_this<clickhouse::Column>);
  return;
}

Assistant:

void ColumnDecimal::Append(const Int128& value) {
    if (data_->Type()->GetCode() == Type::Int32) {
        data_->As<ColumnInt32>()->Append(static_cast<ColumnInt32::DataType>(value));
    } else if (data_->Type()->GetCode() == Type::Int64) {
        data_->As<ColumnInt64>()->Append(static_cast<ColumnInt64::DataType>(value));
    } else {
        data_->As<ColumnInt128>()->Append(static_cast<ColumnInt128::DataType>(value));
    }
}